

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

mode_t get_mode(char *s)

{
  mode_t mode;
  char *s_local;
  
  mode = 0;
  s_local = s;
  while( true ) {
    if (*s_local == '\0') {
      return mode;
    }
    if ((*s_local < '0') || ('7' < *s_local)) break;
    mode = mode << 3 | (int)*s_local - 0x30U;
    s_local = s_local + 1;
  }
  return 0xffffffff;
}

Assistant:

static mode_t get_mode(const char *s) {
    mode_t mode = 0;
    while (*s) {
        if (*s >= '0' && *s <= '7') {
            mode = (mode<<3) | (*s-'0');
        } else {
            return -1;
        }
        s++;
    }
    return mode;
}